

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_compound_statement(gravity_parser_t *parser)

{
  size_t sVar1;
  gtoken_s token_00;
  _Bool _Var2;
  gtoken_t token_01;
  uint uVar3;
  gnode_t **ppgVar4;
  gnode_t *pgVar5;
  gnode_t *local_c8;
  size_t local_b8;
  undefined1 local_a8 [8];
  gtoken_s end_token;
  gnode_t *node;
  gnode_r *local_50;
  gnode_r *stmts;
  gtoken_s token;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
  token.value = (char *)parser->lexer->p[parser->lexer->n - 1];
  gravity_lexer_token((gtoken_s *)&stmts,(gravity_lexer_t *)token.value);
  local_50 = gnode_array_create();
  while( true ) {
    token_01 = gravity_lexer_peek((gravity_lexer_t *)token.value);
    _Var2 = token_isstatement(token_01);
    if (!_Var2) {
      parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
      gravity_lexer_token((gtoken_s *)local_a8,(gravity_lexer_t *)token.value);
      if (parser->declarations->n == 0) {
        local_c8 = (gnode_t *)0x0;
      }
      else {
        local_c8 = parser->declarations->p[parser->declarations->n - 1];
      }
      token_00.colno = token.type;
      token_00._0_8_ = stmts;
      token_00.position = token.lineno;
      token_00.bytes = token.colno;
      token_00.length = token.position;
      token_00.fileid = token.bytes;
      token_00.builtin = token.length;
      token_00.value = (char *)token._24_8_;
      pgVar5 = gnode_block_stat_create
                         (NODE_COMPOUND_STAT,token_00,local_50,local_c8,
                          (end_token.lineno + end_token.position) - token.lineno);
      return pgVar5;
    }
    uVar3 = parser->depth + 1;
    parser->depth = uVar3;
    if (1000 < uVar3) break;
    end_token.value = (char *)parse_statement(parser);
    if ((gnode_t *)end_token.value != (gnode_t *)0x0) {
      if (local_50->n == local_50->m) {
        if (local_50->m == 0) {
          local_b8 = 8;
        }
        else {
          local_b8 = local_50->m << 1;
        }
        local_50->m = local_b8;
        ppgVar4 = (gnode_t **)realloc(local_50->p,local_50->m << 3);
        local_50->p = ppgVar4;
      }
      sVar1 = local_50->n;
      local_50->n = sVar1 + 1;
      local_50->p[sVar1] = (gnode_t *)end_token.value;
    }
    parser->depth = parser->depth - 1;
  }
  gravity_lexer_token((gtoken_s *)&node,(gravity_lexer_t *)token.value);
  report_error(parser,GRAVITY_ERROR_SYNTAX,0x170d91);
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_compound_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_compound_statement");

    // '{' (statement+)? '}'

    // check and consume TOK_OP_OPEN_CURLYBRACE
    parse_required(parser, TOK_OP_OPEN_CURLYBRACE);

    DECLARE_LEXER;
    gtoken_s token = gravity_lexer_token(lexer);
    gnode_r *stmts = gnode_array_create();
    while (token_isstatement(gravity_lexer_peek(lexer))) {
        if (++parser->depth > MAX_RECURSION_DEPTH) {
            REPORT_ERROR(gravity_lexer_token(lexer), "Maximum statement recursion depth reached.");
            return NULL;
        }
        gnode_t *node = parse_statement(parser);
        if (node) gnode_array_push(stmts, node);
        --parser->depth;
    }

    // check and consume TOK_OP_CLOSED_CURLYBRACE
    parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);

	// read current token to extract node total length
	gtoken_s end_token = gravity_lexer_token(lexer);

    return gnode_block_stat_create(NODE_COMPOUND_STAT, token, stmts, LAST_DECLARATION(), end_token.position + end_token.length - token.position);
}